

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O2

bool iDynTree::isDOFBerdyDynamicVariable(BerdyDynamicVariablesTypes dynamicVariableType)

{
  return (dynamicVariableType - DOF_TORQUE & 0xfffffffd) == 0;
}

Assistant:

bool isDOFBerdyDynamicVariable(const BerdyDynamicVariablesTypes dynamicVariableType)
{
    switch(dynamicVariableType)
    {
        case LINK_BODY_PROPER_ACCELERATION:
            return false;
        case NET_INT_AND_EXT_WRENCHES_ON_LINK_WITHOUT_GRAV:
            return false;
        case JOINT_WRENCH:
            return false;
        case DOF_TORQUE:
            return true;
        case NET_EXT_WRENCH:
            return false;
        case DOF_ACCELERATION:
            return true;
        case LINK_BODY_PROPER_CLASSICAL_ACCELERATION:
            return false;
        default:
            return false;
    }
}